

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

void checkHeader(LoadState *S)

{
  lu_byte lVar1;
  lua_Integer lVar2;
  lua_Number lVar3;
  LoadState *S_local;
  
  checkliteral(S,"Lua","not a");
  lVar1 = LoadByte(S);
  if (lVar1 != 'S') {
    error(S,"version mismatch in");
  }
  lVar1 = LoadByte(S);
  if (lVar1 != '\0') {
    error(S,"format mismatch in");
  }
  checkliteral(S,anon_var_dwarf_7710,"corrupted");
  fchecksize(S,4,"int");
  fchecksize(S,8,"size_t");
  fchecksize(S,4,"Instruction");
  fchecksize(S,8,"lua_Integer");
  fchecksize(S,8,"lua_Number");
  lVar2 = LoadInteger(S);
  if (lVar2 != 0x5678) {
    error(S,"endianness mismatch in");
  }
  lVar3 = LoadNumber(S);
  if ((lVar3 == 370.5) && (!NAN(lVar3))) {
    return;
  }
  error(S,"float format mismatch in");
}

Assistant:

static void checkHeader (LoadState *S) {
  /* skip 1st char (already read and checked) */
  checkliteral(S, &LUA_SIGNATURE[1], "not a binary chunk");
  if (loadByte(S) != LUAC_VERSION)
    error(S, "version mismatch");
  if (loadByte(S) != LUAC_FORMAT)
    error(S, "format mismatch");
  checkliteral(S, LUAC_DATA, "corrupted chunk");
  checksize(S, Instruction);
  checksize(S, lua_Integer);
  checksize(S, lua_Number);
  if (loadInteger(S) != LUAC_INT)
    error(S, "integer format mismatch");
  if (loadNumber(S) != LUAC_NUM)
    error(S, "float format mismatch");
}